

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

value_type * __thiscall
FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>
::fastAccessDx(value_type *__return_storage_ptr__,
              FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>
              *this,int i)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  value_type local_30;
  
  FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>::
  fastAccessDx(&local_30,&this->expr_->fadexpr_,i);
  __return_storage_ptr__->val_ = -local_30.val_;
  lVar3 = (long)local_30.dx_.num_elts;
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if (lVar3 < 1) {
    __return_storage_ptr__->defaultVal = 0.0;
  }
  else {
    (__return_storage_ptr__->dx_).num_elts = local_30.dx_.num_elts;
    pdVar1 = (double *)operator_new__(lVar3 * 8);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar1;
    __return_storage_ptr__->defaultVal = 0.0;
    lVar2 = 0;
    do {
      pdVar1[lVar2] = -local_30.dx_.ptr_to_data[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar3 != lVar2);
  }
  Fad<double>::~Fad(&local_30);
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const { return - expr_.fastAccessDx(i);}